

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::BinaryWriterSpec
          (BinaryWriterSpec *this,Stream *json_stream,
          WriteBinarySpecStreamFactory *module_stream_factory,string_view source_filename,
          string_view module_filename_noext,WriteBinaryOptions *options)

{
  _Manager_type p_Var1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  
  this->script_ = (Script *)0x0;
  this->json_stream_ = json_stream;
  *(undefined8 *)&(this->module_stream_factory_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->module_stream_factory_).super__Function_base._M_functor + 8) = 0;
  (this->module_stream_factory_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->module_stream_factory_)._M_invoker = (_Invoker_type)0x0;
  p_Var1 = (module_stream_factory->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->module_stream_factory_,(_Any_data *)module_stream_factory,
              __clone_functor);
    uVar2 = *(undefined4 *)((long)&(module_stream_factory->super__Function_base)._M_manager + 4);
    uVar3 = *(undefined4 *)&module_stream_factory->_M_invoker;
    uVar4 = *(undefined4 *)((long)&module_stream_factory->_M_invoker + 4);
    *(undefined4 *)&(this->module_stream_factory_).super__Function_base._M_manager =
         *(undefined4 *)&(module_stream_factory->super__Function_base)._M_manager;
    *(undefined4 *)((long)&(this->module_stream_factory_).super__Function_base._M_manager + 4) =
         uVar2;
    *(undefined4 *)&(this->module_stream_factory_)._M_invoker = uVar3;
    *(undefined4 *)((long)&(this->module_stream_factory_)._M_invoker + 4) = uVar4;
  }
  (this->source_filename_)._M_dataplus._M_p = (pointer)&(this->source_filename_).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->source_filename_,source_filename._M_str,
             source_filename._M_str + source_filename._M_len);
  (this->module_filename_noext_)._M_dataplus._M_p = (pointer)&(this->module_filename_noext_).field_2
  ;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->module_filename_noext_,module_filename_noext._M_len,
             &(options->features).exceptions_enabled_ + module_filename_noext._M_len);
  this->options_ = (WriteBinaryOptions *)module_filename_noext._M_str;
  (this->result_).enum_ = Ok;
  this->num_modules_ = 0;
  return;
}

Assistant:

BinaryWriterSpec::BinaryWriterSpec(
    Stream* json_stream,
    WriteBinarySpecStreamFactory module_stream_factory,
    std::string_view source_filename,
    std::string_view module_filename_noext,
    const WriteBinaryOptions& options)
    : json_stream_(json_stream),
      module_stream_factory_(module_stream_factory),
      source_filename_(source_filename),
      module_filename_noext_(module_filename_noext),
      options_(options) {}